

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::Stage::GetPrimFromRelativePath_abi_cxx11_
          (expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Stage *this,Prim *root,Path *path)

{
  size_type sVar1;
  unexpected_type<const_char_*> local_10;
  
  if (path->_valid == false) {
    local_10.m_error = "Path is invalid.\n";
    goto LAB_0033bb9d;
  }
  sVar1 = (path->_prim_part)._M_string_length;
  if (sVar1 != 0) {
    if (*(path->_prim_part)._M_dataplus._M_p == '/') {
      local_10.m_error = "Path is absolute. Path must be relative.\n";
      goto LAB_0033bb9d;
    }
    if ((sVar1 != 0) && (*(path->_prim_part)._M_dataplus._M_p == '/')) {
      local_10.m_error = "Invalid Path.\n";
      goto LAB_0033bb9d;
    }
  }
  local_10.m_error = "GetPrimFromRelativePath is TODO";
LAB_0033bb9d:
  nonstd::expected_lite::
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<const_char_*,_0>(__return_storage_ptr__,&local_10);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<const Prim *, std::string> Stage::GetPrimFromRelativePath(
    const Prim &root, const Path &path) const {
  // TODO: Resolve "../"
  // TODO: cache path

  if (!path.is_valid()) {
    return nonstd::make_unexpected("Path is invalid.\n");
  }

  if (path.is_absolute_path()) {
    return nonstd::make_unexpected(
        "Path is absolute. Path must be relative.\n");
  }

  if (path.is_relative_path()) {
    // ok
  } else {
    return nonstd::make_unexpected("Invalid Path.\n");
  }

#if 0  // TODO
  Path abs_path = root.element_path();
  abs_path.AppendElement(path.GetPrimPart());

  DCOUT("root path = " << root.path());
  DCOUT("abs path = " << abs_path);

  // Brute-force search from Stage root.
  if (auto pv = GetPrimAtPathRec(&root, /* root */"", abs_path, /* depth */0)) {
    return pv.value();
  }

  return nonstd::make_unexpected("Cannot find path <" + path.full_path_name() +
                                 "> under Prim: " + to_string(root.path) +
                                 "\n");
#else
  (void)root;
  return nonstd::make_unexpected("GetPrimFromRelativePath is TODO");
#endif
}